

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::FunctionBody::GetLineCharOffsetFromStartChar
          (FunctionBody *this,int startCharOfStatement,ULONG *_line,LONG *_charOffset,
          bool canAllocateLineCache)

{
  SourceContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  HRESULT HVar4;
  undefined4 *puVar5;
  SRCINFO *pSVar6;
  ULONG UVar7;
  Utf8SourceInfo *this_00;
  charcount_t local_54;
  charcount_t *pcStack_50;
  charcount_t cacheLine;
  charcount_t local_44;
  ULONG *pUStack_40;
  charcount_t lineByteOffset;
  charcount_t local_34 [2];
  charcount_t column;
  
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  pUStack_40 = _line;
  if (((this_00->field_0xa8 & 4) != 0) &&
     (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44 & 8) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc95,
                                "(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode())"
                                ,
                                "!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode()"
                               );
    if (!bVar3) goto LAB_00763bde;
    *puVar5 = 0;
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  }
  pSVar6 = (this_00->m_srcInfo).ptr;
  UVar7 = pSVar6->dlnHost - pSVar6->lnMinHost;
  local_34[0] = 0;
  local_44 = 0;
  if (0 < startCharOfStatement) {
    bVar3 = true;
    pcStack_50 = (charcount_t *)_charOffset;
    if (canAllocateLineCache) {
      HVar4 = Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(this_00);
      if (HVar4 < 0) {
        if (HVar4 == -0x7fffbffc) {
          return false;
        }
        if (HVar4 != -0x7ff8fff2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0xca7,"(hr == ((HRESULT)0x80004004L))","hr == E_ABORT");
          if (bVar3) {
            *puVar5 = 0;
            return false;
          }
LAB_00763bde:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        m_lineOffsetCache).ptr = (LineOffsetCache *)0x0;
      }
      else {
        bVar3 = false;
      }
    }
    local_54 = 0;
    Utf8SourceInfo::GetLineInfoForCharPosition
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
               startCharOfStatement,&local_54,local_34,&local_44,bVar3);
    UVar7 = UVar7 + local_54;
    pSVar6 = (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr;
    _charOffset = (LONG *)pcStack_50;
  }
  pSVar1 = (pSVar6->sourceContextInfo).ptr;
  if ((pSVar1->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar1->isHostDynamicDocument & 1U) != 0)) {
    UVar7 = UVar7 + (int)((char)((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47
                                << 6) >> 7);
  }
  if (pUStack_40 != (ULONG *)0x0) {
    *pUStack_40 = UVar7;
  }
  if (((charcount_t *)_charOffset != (charcount_t *)0x0) &&
     (*_charOffset = local_34[0], pSVar6->dlnHost == UVar7)) {
    *_charOffset = local_34[0] + pSVar6->ulColumnHost;
  }
  return true;
}

Assistant:

bool FunctionBody::GetLineCharOffsetFromStartChar(int startCharOfStatement, ULONG* _line, LONG* _charOffset, bool canAllocateLineCache /*= true*/)
    {
        Assert(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode());

        // The following adjusts for where the script is within the document
        ULONG line = this->GetHostStartLine();
        charcount_t column = 0;
        ULONG lineCharOffset = 0;
        charcount_t lineByteOffset = 0;

        if (startCharOfStatement > 0)
        {
            bool doSlowLookup = !canAllocateLineCache;
            if (canAllocateLineCache)
            {
                HRESULT hr = this->GetUtf8SourceInfo()->EnsureLineOffsetCacheNoThrow();
                if (FAILED(hr))
                {
                    if (hr != E_OUTOFMEMORY)
                    {
                        Assert(hr == E_ABORT); // The only other possible error we know about is ScriptAbort from QueryContinue.
                        return false;
                    }

                    // Clear the cache so it is not used.
                    this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

                    // We can try and do the slow lookup below
                    doSlowLookup = true;
                }
            }

            charcount_t cacheLine = 0;
            this->GetUtf8SourceInfo()->GetLineInfoForCharPosition(startCharOfStatement, &cacheLine, &column, &lineByteOffset, doSlowLookup);

            // Update the tracking variables to jump to the line position (only need to jump if not on the first line).
            if (cacheLine > 0)
            {
                line += cacheLine;
                lineCharOffset = startCharOfStatement - column;
            }
        }

        if (this->GetSourceContextInfo()->IsDynamic() && this->m_isDynamicFunction)
        {
            line -= JavascriptFunction::numberLinesPrependedToAnonymousFunction;
        }

        if(_line)
        {
            *_line = line;
        }

        if(_charOffset)
        {
            *_charOffset = column;

            // If we are at the beginning of the host code, adjust the offset based on the host provided offset
            if (this->GetHostSrcInfo()->dlnHost == line)
            {
                *_charOffset += (LONG)this->GetHostStartColumn();
            }
        }

        return true;
    }